

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O2

string * CLI::detail::fix_newlines(string *__return_storage_ptr__,string *leader,string *input)

{
  long lVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = 0;
  while ((uVar2 != 0xffffffffffffffff && (uVar2 < input->_M_string_length))) {
    lVar1 = ::std::__cxx11::string::find((char)input,10);
    uVar2 = 0xffffffffffffffff;
    if (lVar1 != -1) {
      ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)input);
      ::std::operator+(&local_70,&local_b0,leader);
      ::std::__cxx11::string::substr((ulong)&local_90,(ulong)input);
      ::std::operator+(&local_50,&local_70,&local_90);
      ::std::__cxx11::string::operator=((string *)input,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_b0);
      uVar2 = lVar1 + leader->_M_string_length;
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string fix_newlines(const std::string &leader, std::string input) {
    std::string::size_type n = 0;
    while(n != std::string::npos && n < input.size()) {
        n = input.find('\n', n);
        if(n != std::string::npos) {
            input = input.substr(0, n + 1) + leader + input.substr(n + 1);
            n += leader.size();
        }
    }
    return input;
}